

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::RootPhpNamespace<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,bool is_descriptor)

{
  long lVar1;
  string *full_name;
  string *psVar2;
  allocator *paVar3;
  allocator local_a;
  allocator local_9;
  
  lVar1 = *(long *)(*(long *)(desc + 0x10) + 0x88);
  if ((*(byte *)(lVar1 + 0x28) & 0x80) == 0) {
    full_name = *(string **)(*(long *)(desc + 0x10) + 8);
    if (full_name->_M_string_length != 0) {
      PhpName(__return_storage_ptr__,full_name,is_descriptor);
      return __return_storage_ptr__;
    }
    paVar3 = &local_a;
  }
  else {
    psVar2 = *(string **)(lVar1 + 0x80);
    if (*(long *)(psVar2 + 8) != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
      return __return_storage_ptr__;
    }
    paVar3 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string RootPhpNamespace(const DescriptorType* desc, bool is_descriptor) {
  if (desc->file()->options().has_php_namespace()) {
    const string& php_namespace = desc->file()->options().php_namespace();
    if (!php_namespace.empty()) {
      return php_namespace;
    }
    return "";
  }

  if (!desc->file()->package().empty()) {
    return PhpName(desc->file()->package(), is_descriptor);
  }
  return "";
}